

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_disabled.cpp
# Opt level: O3

void test_trace(void)

{
  string local_50;
  string local_30;
  
  SpyingSerial::clear(&Serial);
  std::__cxx11::stringbuf::str();
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  ASSERT_RE(&local_30,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void test_trace() {
  Serial.clear();
  TRACE();
  ASSERT_RE(Serial.log(), "");
}